

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyjson.h
# Opt level: O0

void __thiscall tinyjson::json_node::~json_node(json_node *this)

{
  node_type nVar1;
  string *psVar2;
  json_node *pjVar3;
  linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
  *this_00;
  bool bVar4;
  reference ppjVar5;
  reference ppVar6;
  json_node *this_local;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
  *elem_1;
  iterator __end3_1;
  iterator __begin3_1;
  object *__range3_1;
  json_node *elem;
  iterator __end3;
  iterator __begin3;
  array *__range3;
  
  nVar1 = this->type;
  if (nVar1 == string_type) {
    psVar2 = (this->storage).str_val;
    if (psVar2 != (string *)0x0) {
      std::__cxx11::string::~string((string *)psVar2);
      operator_delete(psVar2,0x20);
    }
  }
  else if (nVar1 == array_type) {
    psVar2 = (this->storage).str_val;
    __end3 = std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>::begin
                       ((vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
                        psVar2);
    elem = (json_node *)
           std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>::end
                     ((vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)
                      psVar2);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<tinyjson::json_node_**,_std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>_>
                                       *)&elem), bVar4) {
      ppjVar5 = __gnu_cxx::
                __normal_iterator<tinyjson::json_node_**,_std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>_>
                ::operator*(&__end3);
      pjVar3 = *ppjVar5;
      if (pjVar3 != (json_node *)0x0) {
        ~json_node(pjVar3);
        operator_delete(pjVar3,0x10);
      }
      __gnu_cxx::
      __normal_iterator<tinyjson::json_node_**,_std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>_>
      ::operator++(&__end3);
    }
    psVar2 = (this->storage).str_val;
    if (psVar2 != (string *)0x0) {
      std::vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_>::~vector
                ((vector<tinyjson::json_node_*,_std::allocator<tinyjson::json_node_*>_> *)psVar2);
      operator_delete(psVar2,0x18);
    }
  }
  else if (nVar1 == object_type) {
    psVar2 = (this->storage).str_val;
    __end3_1._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
         ::begin((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
                  *)psVar2);
    elem_1 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
              *)std::__cxx11::
                list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
                ::end((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>_>
                       *)psVar2);
    while (bVar4 = std::operator!=(&__end3_1,(_Self *)&elem_1), bVar4) {
      ppVar6 = std::
               _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>
               ::operator*(&__end3_1);
      pjVar3 = ppVar6->second;
      if (pjVar3 != (json_node *)0x0) {
        ~json_node(pjVar3);
        operator_delete(pjVar3,0x10);
      }
      std::
      _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>_>
      ::operator++(&__end3_1);
    }
    this_00 = (linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
               *)(this->storage).str_val;
    if (this_00 !=
        (linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
         *)0x0) {
      linked_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyjson::json_node_*>
      ::~linked_hash_map(this_00);
      operator_delete(this_00,0x50);
    }
  }
  return;
}

Assistant:

~json_node() {
      clear();
    }